

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O1

void __thiscall
Clasp::DefaultUnfoundedCheck::DefaultUnfoundedCheck
          (DefaultUnfoundedCheck *this,DependencyGraph *g,ReasonStrategy st)

{
  PostPropagator::PostPropagator(&this->super_PostPropagator);
  (this->super_PostPropagator).super_Constraint._vptr_Constraint =
       (_func_int **)&PTR_propagate_001eb0a0;
  this->solver_ = (Solver *)0x0;
  this->graph_ = g;
  (this->ufs_).vec.ebo_.buf = (pointer)0x0;
  (this->ufs_).vec.ebo_.size = 0;
  (this->ufs_).vec.ebo_.cap = 0;
  (this->ufs_).qFront = 0;
  (this->atoms_).ebo_.buf = (pointer)0x0;
  (this->atoms_).ebo_.size = 0;
  (this->atoms_).ebo_.cap = 0;
  (this->bodies_).ebo_.buf = (pointer)0x0;
  (this->bodies_).ebo_.size = 0;
  (this->bodies_).ebo_.cap = 0;
  (this->todo_).vec.ebo_.buf = (pointer)0x0;
  (this->todo_).vec.ebo_.size = 0;
  (this->todo_).vec.ebo_.cap = 0;
  (this->todo_).qFront = 0;
  (this->invalidQ_).ebo_.buf = (pointer)0x0;
  (this->invalidQ_).ebo_.size = 0;
  (this->invalidQ_).ebo_.cap = 0;
  (this->sourceQ_).ebo_.buf = (pointer)0x0;
  (this->sourceQ_).ebo_.size = 0;
  (this->sourceQ_).ebo_.cap = 0;
  (this->extended_).ebo_.buf = (pointer)0x0;
  (this->extended_).ebo_.size = 0;
  (this->extended_).ebo_.cap = 0;
  (this->watches_).ebo_.buf = (pointer)0x0;
  (this->watches_).ebo_.size = 0;
  (this->watches_).ebo_.cap = 0;
  (this->pickedExt_).ebo_.buf = (pointer)0x0;
  (this->pickedExt_).ebo_.size = 0;
  (this->pickedExt_).ebo_.cap = 0;
  (this->loopAtoms_).ebo_.buf = (pointer)0x0;
  (this->loopAtoms_).ebo_.size = 0;
  (this->loopAtoms_).ebo_.cap = 0;
  (this->activeClause_).ebo_.buf = (pointer)0x0;
  (this->activeClause_).ebo_.size = 0;
  (this->activeClause_).ebo_.cap = 0;
  *(undefined8 *)&(this->activeClause_).ebo_.cap = 0;
  *(undefined8 *)((long)&this->reasons_ + 4) = 0;
  this->strategy_ = st;
  (this->mini_).ptr_ = 0;
  return;
}

Assistant:

DefaultUnfoundedCheck::DefaultUnfoundedCheck(DependencyGraph& g, ReasonStrategy st)
	: solver_(0)
	, graph_(&g)
	, mini_(0)
	, reasons_(0)
	, strategy_(st) {
	mini_.release();
}